

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Builder::StartEdge(Builder *this,Edge *edge,string *err)

{
  CommandRunner *pCVar1;
  Metrics *this_00;
  bool bVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  Metric *pMVar6;
  size_type *psVar7;
  bool bVar8;
  pointer ppNVar9;
  string rspfile;
  string content;
  ScopedMetric metrics_h_scoped;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  ScopedMetric local_40;
  
  if (StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar4 = __cxa_guard_acquire(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
    this_00 = g_metrics;
    if (iVar4 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar6 = (Metric *)0x0;
      }
      else {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"StartEdge","");
        pMVar6 = Metrics::NewMetric(this_00,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      StartEdge::metrics_h_metric = pMVar6;
      __cxa_guard_release(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&local_40,StartEdge::metrics_h_metric);
  bVar2 = Edge::is_phony(edge);
  bVar8 = true;
  if (bVar2) goto LAB_00109c8e;
  BuildStatus::BuildEdgeStarted(this->status_,edge);
  for (ppNVar9 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppNVar9 !=
      (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppNVar9 = ppNVar9 + 1) {
    bVar2 = DiskInterface::MakeDirs(this->disk_interface_,&(*ppNVar9)->path_);
    if (!bVar2) {
      bVar8 = false;
      goto LAB_00109c8e;
    }
  }
  Edge::GetUnescapedRspfile_abi_cxx11_(&local_a0,edge);
  if (local_a0._M_string_length == 0) {
LAB_00109b31:
    pCVar1 = (this->command_runner_)._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    iVar4 = (*pCVar1->_vptr_CommandRunner[3])(pCVar1,edge);
    bVar8 = true;
    if ((char)iVar4 == '\0') {
      Edge::EvaluateCommand_abi_cxx11_(&local_60,edge,false);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1206ed);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_c0.field_2._M_allocated_capacity = *psVar7;
        local_c0.field_2._8_8_ = plVar5[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar7;
        local_c0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_c0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_80.field_2._M_allocated_capacity = *psVar7;
        local_80.field_2._8_8_ = plVar5[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar7;
        local_80._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_80._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00109c71;
    }
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"rspfile_content","");
    Edge::GetBinding(&local_80,edge,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    cVar3 = (**(code **)(*(long *)this->disk_interface_ + 0x28))
                      (this->disk_interface_,&local_a0,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (cVar3 != '\0') goto LAB_00109b31;
LAB_00109c71:
    bVar8 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
LAB_00109c8e:
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar8;
}

Assistant:

bool Builder::StartEdge(Edge* edge, string* err) {
  METRIC_RECORD("StartEdge");
  if (edge->is_phony())
    return true;

  status_->BuildEdgeStarted(edge);

  // Create directories necessary for outputs.
  // XXX: this will block; do we care?
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!disk_interface_->MakeDirs((*o)->path()))
      return false;
  }

  // Create response file, if needed
  // XXX: this may also block; do we care?
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty()) {
    string content = edge->GetBinding("rspfile_content");
    if (!disk_interface_->WriteFile(rspfile, content))
      return false;
  }

  // start command computing and run it
  if (!command_runner_->StartCommand(edge)) {
    err->assign("command '" + edge->EvaluateCommand() + "' failed.");
    return false;
  }

  return true;
}